

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel.h
# Opt level: O0

QVariant * __thiscall QModelIndex::data(QModelIndex *this,int arole)

{
  bool bVar1;
  QAbstractItemModel *pQVar2;
  undefined4 in_EDX;
  undefined8 in_RSI;
  QVariant *in_RDI;
  
  bVar1 = Qt::totally_ordered_wrapper::operator_cast_to_bool
                    ((totally_ordered_wrapper<const_QAbstractItemModel_*> *)0x5406d6);
  if (bVar1) {
    pQVar2 = Qt::totally_ordered_wrapper<const_QAbstractItemModel_*>::operator->
                       ((totally_ordered_wrapper<const_QAbstractItemModel_*> *)0x5406ea);
    (**(code **)(*(long *)pQVar2 + 0x90))(in_RDI,pQVar2,in_RSI,in_EDX);
  }
  else {
    ::QVariant::QVariant((QVariant *)0x540710);
  }
  return in_RDI;
}

Assistant:

inline QVariant QModelIndex::data(int arole) const
{ return m ? m->data(*this, arole) : QVariant(); }